

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core_read.cpp
# Opt level: O3

bool DecodeHexBlockHeader(CBlockHeader *header,string *hex_header)

{
  bool bVar1;
  long in_FS_OFFSET;
  string_view str;
  string_view hex_str;
  Span<const_std::byte> sp;
  DataStream ser_header;
  vector<unsigned_char,_std::allocator<unsigned_char>_> header_data;
  DataStream local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  str._M_str = (hex_header->_M_dataplus)._M_p;
  str._M_len = hex_header->_M_string_length;
  bVar1 = IsHex(str);
  if (bVar1) {
    hex_str._M_str = (hex_header->_M_dataplus)._M_p;
    hex_str._M_len = hex_header->_M_string_length;
    ParseHex<unsigned_char>(&local_30,hex_str);
    sp.m_size = (long)local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
    sp.m_data = local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
    DataStream::DataStream(&local_50,sp);
    bVar1 = true;
    ActionUnserialize::
    SerReadWriteMany<DataStream,int&,uint256&,uint256&,unsigned_int&,unsigned_int&,unsigned_int&>
              (&local_50,&header->nVersion,&header->hashPrevBlock,&header->hashMerkleRoot,
               &header->nTime,&header->nBits,&header->nNonce);
    std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
              ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_50);
    if (local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (byte *)0x0) {
      operator_delete(local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_30.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_30.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    bVar1 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool DecodeHexBlockHeader(CBlockHeader& header, const std::string& hex_header)
{
    if (!IsHex(hex_header)) return false;

    const std::vector<unsigned char> header_data{ParseHex(hex_header)};
    DataStream ser_header{header_data};
    try {
        ser_header >> header;
    } catch (const std::exception&) {
        return false;
    }
    return true;
}